

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O1

void gimage::anon_unknown_6::readRow<unsigned_short>
               (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *ret,uint32_t k,
               TiffImage<unsigned_short> *tif,uint32_t row,uint16_t d)

{
  uint uVar1;
  unsigned_short *ret_00;
  unsigned_short ***pppuVar2;
  pointer puVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
            (ret,(ulong)tif->width,(ulong)tif->height,(ulong)tif->depth);
  if ((tif->is_planar == false) && (tif->depth != 1)) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              (&tif->row,(ulong)((uint)tif->depth * tif->width));
    ret_00 = (tif->row).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    readUnpacked<unsigned_short>
              (ret_00,(uint32_t)
                      ((ulong)((long)(tif->row).
                                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ret_00) >> 1
                      ),tif,row,0);
    uVar1 = tif->width;
    if ((ulong)uVar1 != 0) {
      puVar3 = (tif->row).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pppuVar2 = ret->img;
      uVar4 = 0;
      do {
        if (tif->depth != 0) {
          lVar5 = 0;
          uVar6 = 0;
          do {
            pppuVar2[uVar6][k][uVar4] = puVar3[uVar6];
            uVar6 = uVar6 + 1;
            lVar5 = lVar5 + 2;
          } while (uVar6 < tif->depth);
          puVar3 = (pointer)((long)puVar3 + lVar5);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != uVar1);
    }
    return;
  }
  readUnpacked<unsigned_short>(ret->img[d][k],tif->width,tif,row,d);
  return;
}

Assistant:

void readRow(gimage::Image<T> &ret, uint32_t k, TiffImage<T> &tif, uint32_t row,
  uint16_t d)
{
  ret.setSize(tif.width, tif.height, tif.depth);

  if (tif.is_planar || tif.depth == 1)
  {
    readUnpacked(ret.getPtr(0, k, d), tif.width, tif, row, d);
  }
  else
  {
    tif.row.resize(tif.width*tif.depth);
    readUnpacked(tif.row.data(), static_cast<uint32_t>(tif.row.size()), tif, row, 0);

    T *p=tif.row.data();
    for (uint32_t i=0; i<tif.width; i++)
    {
      for (uint16_t d=0; d<tif.depth; d++)
      {
        ret.set(i, k, d, *p++);
      }
    }
  }
}